

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O1

QString * language::boolValue(QString *__return_storage_ptr__,bool v)

{
  Data *pDVar1;
  long *plVar2;
  undefined8 *puVar3;
  qsizetype *pqVar4;
  
  if (_language == 0) {
    plVar2 = &cppFalse;
    if (v) {
      plVar2 = &cppTrue;
    }
    puVar3 = (undefined8 *)&DAT_0019d308;
    if (v) {
      puVar3 = &DAT_0019d2f0;
    }
    pqVar4 = (qsizetype *)&DAT_0019d310;
    if (v) {
      pqVar4 = &DAT_0019d2f8;
    }
    pDVar1 = (Data *)*plVar2;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (char16_t *)*puVar3;
    (__return_storage_ptr__->d).size = *pqVar4;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    if (v) {
      (__return_storage_ptr__->d).ptr = L"True";
      (__return_storage_ptr__->d).size = 4;
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->d).ptr = L"False";
    (__return_storage_ptr__->d).size = 5;
  }
  return __return_storage_ptr__;
}

Assistant:

QString boolValue(bool v)
{
    switch (language()) {
    case Language::Cpp:
        return v ? cppTrue : cppFalse;
    case Language::Python:
        return v ? QStringLiteral("True") : QStringLiteral("False");
    }
    Q_UNREACHABLE();
}